

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_from_python.hpp
# Opt level: O0

void boost::python::converter::shared_ptr_from_python<AbstractModuleClient,_boost::shared_ptr>::
     construct(PyObject *source,rvalue_from_python_stage1_data *data)

{
  shared_ptr<void> *in_RSI;
  _object *in_RDI;
  shared_ptr<void> hold_convertible_ref_count;
  void *storage;
  shared_ptr<void> *in_stack_ffffffffffffffa8;
  shared_ptr<AbstractModuleClient> *this;
  shared_ptr<AbstractModuleClient> local_38;
  shared_ptr_deleter *in_stack_ffffffffffffffe0;
  shared_ptr<void> *p;
  
  p = in_RSI + 1;
  if ((_object *)in_RSI->px == in_RDI) {
    shared_ptr<AbstractModuleClient>::shared_ptr((shared_ptr<AbstractModuleClient> *)0x3e3835);
  }
  else {
    borrowed<_object>(in_RDI);
    this = &local_38;
    handle<_object>::handle<boost::python::detail::borrowed<_object>>
              ((handle<_object> *)this,(borrowed<_object> *)in_stack_ffffffffffffffa8);
    shared_ptr_deleter::shared_ptr_deleter((shared_ptr_deleter *)&local_38.pn,this);
    boost::shared_ptr<void>::shared_ptr<void,boost::python::converter::shared_ptr_deleter>
              (in_RSI,p,in_stack_ffffffffffffffe0);
    shared_ptr_deleter::~shared_ptr_deleter((shared_ptr_deleter *)&local_38.pn);
    handle<_object>::~handle((handle<_object> *)0x3e3890);
    shared_ptr<AbstractModuleClient>::shared_ptr<void>
              (this,in_stack_ffffffffffffffa8,(element_type *)0x3e38a7);
    boost::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x3e38b1);
  }
  in_RSI->px = p;
  return;
}

Assistant:

static void construct(PyObject* source, rvalue_from_python_stage1_data* data)
  {
    void* const storage = ((converter::rvalue_from_python_storage<SP<T> >*)data)->storage.bytes;
    // Deal with the "None" case.
    if (data->convertible == source)
      new (storage) SP<T>();
    else
    {
      SP<void> hold_convertible_ref_count(
	 (void*)0, shared_ptr_deleter(handle<>(borrowed(source))) );
      // use aliasing constructor
      new (storage) SP<T>(hold_convertible_ref_count,
			  static_cast<T*>(data->convertible));
    }

    data->convertible = storage;
  }